

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

int uv_async_send(uv_async_t *handle)

{
  int iVar1;
  uv_async_t *handle_local;
  
  if ((handle->pending == 0) && (iVar1 = cmpxchgi(&handle->pending,0,1), iVar1 == 0)) {
    uv__async_send(handle->loop);
    iVar1 = cmpxchgi(&handle->pending,1,2);
    if (iVar1 != 1) {
      abort();
    }
  }
  return 0;
}

Assistant:

int uv_async_send(uv_async_t* handle) {
  /* Do a cheap read first. */
  if (ACCESS_ONCE(int, handle->pending) != 0)
    return 0;

  /* Tell the other thread we're busy with the handle. */
  if (cmpxchgi(&handle->pending, 0, 1) != 0)
    return 0;

  /* Wake up the other thread's event loop. */
  uv__async_send(handle->loop);

  /* Tell the other thread we're done. */
  if (cmpxchgi(&handle->pending, 1, 2) != 1)
    abort();

  return 0;
}